

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O2

ReadFileResult anon_unknown.dwarf_d8a44b::TestPresetExecutionModeHelper(ModeEnum *out,Value *value)

{
  bool bVar1;
  ModeEnum MVar2;
  String SStack_48;
  
  if (value != (Value *)0x0) {
    bVar1 = Json::Value::isString(value);
    if (!bVar1) {
      return INVALID_PRESET;
    }
    Json::Value::asString_abi_cxx11_(&SStack_48,value);
    bVar1 = std::operator==(&SStack_48,"until-fail");
    std::__cxx11::string::~string((string *)&SStack_48);
    MVar2 = UntilFail;
    if (!bVar1) {
      Json::Value::asString_abi_cxx11_(&SStack_48,value);
      bVar1 = std::operator==(&SStack_48,"until-pass");
      std::__cxx11::string::~string((string *)&SStack_48);
      if (bVar1) {
        MVar2 = UntilPass;
      }
      else {
        Json::Value::asString_abi_cxx11_(&SStack_48,value);
        bVar1 = std::operator==(&SStack_48,"after-timeout");
        std::__cxx11::string::~string((string *)&SStack_48);
        if (!bVar1) {
          return INVALID_PRESET;
        }
        MVar2 = AfterTimeout;
      }
    }
    *out = MVar2;
  }
  return READ_OK;
}

Assistant:

ReadFileResult TestPresetExecutionModeHelper(
  TestPreset::ExecutionOptions::RepeatOptions::ModeEnum& out,
  const Json::Value* value)
{
  if (!value) {
    return ReadFileResult::READ_OK;
  }

  if (!value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "until-fail") {
    out = TestPreset::ExecutionOptions::RepeatOptions::ModeEnum::UntilFail;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "until-pass") {
    out = TestPreset::ExecutionOptions::RepeatOptions::ModeEnum::UntilPass;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "after-timeout") {
    out = TestPreset::ExecutionOptions::RepeatOptions::ModeEnum::AfterTimeout;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}